

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.h
# Opt level: O3

void __thiscall
bvh_node::bvh_node(bvh_node *this,
                  vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                  *objects,size_t start,size_t end,double time0,double time1)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  shared_ptr<hittable> *psVar7;
  size_t sVar8;
  double dVar9;
  double dVar10;
  bool bVar11;
  int iVar12;
  char *pcVar13;
  code *pcVar14;
  ulong uVar15;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Iter_comp_iter<bool_(*)(std::shared_ptr<hittable>,_std::shared_ptr<hittable>)> __comp;
  pointer psVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  shared_ptr<hittable> sVar21;
  shared_ptr<hittable> sVar22;
  undefined1 local_e9;
  vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_> *local_e8;
  double time1_local;
  double time0_local;
  size_t start_local;
  element_type *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  element_type local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  aabb box_left;
  size_t end_local;
  aabb box_right;
  
  (this->super_hittable)._vptr_hittable = (_func_int **)&PTR_hit_0012e030;
  (this->left).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->left).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->right).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->right).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->box)._min.e[0] = 0.0;
  (this->box)._min.e[1] = 0.0;
  (this->box)._min.e[2] = 0.0;
  (this->box)._max.e[0] = 0.0;
  (this->box)._max.e[1] = 0.0;
  (this->box)._max.e[2] = 0.0;
  time1_local = time1;
  time0_local = time0;
  start_local = start;
  end_local = end;
  iVar12 = rand();
  iVar12 = (int)((double)iVar12 * 4.656612873077393e-10 * 3.0 + 0.0);
  pcVar14 = box_z_compare;
  if (iVar12 == 1) {
    pcVar14 = box_y_compare;
  }
  __comp._M_comp = box_x_compare;
  if (iVar12 != 0) {
    __comp._M_comp = pcVar14;
  }
  uVar15 = end - start;
  psVar16 = (objects->
            super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_e8 = objects;
  if (uVar15 == 2) {
    local_b8._vptr_hittable =
         (_func_int **)
         psVar16[start].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_b0 = psVar16[start].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
    pcVar13 = (char *)local_b8._vptr_hittable;
    if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar13 = &__libc_single_threaded;
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_b0->_M_use_count = local_b0->_M_use_count + 1;
        UNLOCK();
        psVar16 = (objects->
                  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        start = start_local;
      }
      else {
        local_b0->_M_use_count = local_b0->_M_use_count + 1;
      }
    }
    local_c8 = psVar16[start + 1].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_c0 = psVar16[start + 1].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
    if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar13 = &__libc_single_threaded;
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_c0->_M_use_count = local_c0->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_c0->_M_use_count = local_c0->_M_use_count + 1;
      }
    }
    sVar21.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_c8;
    sVar21.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &local_b8;
    sVar22.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pcVar13;
    sVar22.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)pcVar14
    ;
    bVar11 = (*__comp._M_comp)(sVar21,sVar22);
    if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
    }
    if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
    }
    sVar8 = start_local;
    psVar16 = (objects->
              super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
              )._M_impl.super__Vector_impl_data._M_start + start_local;
    psVar7 = &this->right;
    if (bVar11) {
      (this->left).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (psVar16->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->left).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &(psVar16->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
      psVar16 = (objects->
                super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                )._M_impl.super__Vector_impl_data._M_start + sVar8 + 1;
    }
    else {
      (this->left).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           psVar16[1].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->left).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &psVar16[1].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      psVar16 = (objects->
                super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                )._M_impl.super__Vector_impl_data._M_start + sVar8;
    }
    this_00 = &(psVar16->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount;
    (this->right).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (psVar16->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
LAB_00105ead:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(psVar7->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
               this_00);
  }
  else {
    if (uVar15 == 1) {
      (this->right).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           psVar16[start].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      this_00 = &(this->right).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (this_00,&psVar16[start].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      (this->left).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (this->right).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      psVar7 = &this->left;
      goto LAB_00105ead;
    }
    if (end != start) {
      uVar17 = (long)(end * 0x10 + start * -0x10) >> 4;
      lVar3 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::shared_ptr<hittable>*,std::vector<std::shared_ptr<hittable>,std::allocator<std::shared_ptr<hittable>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::shared_ptr<hittable>,std::shared_ptr<hittable>)>>
                (psVar16 + start,psVar16 + end,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,__comp);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::shared_ptr<hittable>*,std::vector<std::shared_ptr<hittable>,std::allocator<std::shared_ptr<hittable>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::shared_ptr<hittable>,std::shared_ptr<hittable>)>>
                (psVar16 + start,psVar16 + end,__comp);
    }
    box_right._min.e[0] = (double)((uVar15 >> 1) + start);
    box_left._min.e[0] = 0.0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<bvh_node,std::allocator<bvh_node>,std::vector<std::shared_ptr<hittable>,std::allocator<std::shared_ptr<hittable>>>&,unsigned_long&,unsigned_long&,double&,double&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(box_left._min.e + 1),
               (bvh_node **)&box_left,(allocator<bvh_node> *)&local_e9,local_e8,&start_local,
               (unsigned_long *)&box_right,&time0_local,&time1_local);
    dVar10 = box_left._min.e[1];
    dVar9 = box_left._min.e[0];
    box_left._min.e[0] = 0.0;
    box_left._min.e[1] = 0.0;
    p_Var1 = (this->left).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (this->left).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)dVar9;
    (this->left).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar10;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      if (box_left._min.e[1] != 0.0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)box_left._min.e[1]);
      }
    }
    box_left._min.e[0] = 0.0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<bvh_node,std::allocator<bvh_node>,std::vector<std::shared_ptr<hittable>,std::allocator<std::shared_ptr<hittable>>>&,unsigned_long&,unsigned_long&,double&,double&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(box_left._min.e + 1),
               (bvh_node **)&box_left,(allocator<bvh_node> *)&local_e9,local_e8,
               (unsigned_long *)&box_right,&end_local,&time0_local,&time1_local);
    dVar10 = box_left._min.e[1];
    dVar9 = box_left._min.e[0];
    box_left._min.e[0] = 0.0;
    box_left._min.e[1] = 0.0;
    p_Var1 = (this->right).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (this->right).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)dVar9;
    (this->right).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar10;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      if (box_left._min.e[1] != 0.0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)box_left._min.e[1]);
      }
    }
  }
  box_left._max.e[1] = 0.0;
  box_left._max.e[2] = 0.0;
  box_left._min.e[2] = 0.0;
  box_left._max.e[0] = 0.0;
  box_left._min.e[0] = 0.0;
  box_left._min.e[1] = 0.0;
  box_right._max.e[1] = 0.0;
  box_right._max.e[2] = 0.0;
  box_right._min.e[2] = 0.0;
  box_right._max.e[0] = 0.0;
  box_right._min.e[0] = 0.0;
  box_right._min.e[1] = 0.0;
  iVar12 = (*((this->left).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_hittable[1])(SUB84(time0_local,0),time1_local);
  if ((char)iVar12 != '\0') {
    peVar2 = (this->right).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar12 = (*peVar2->_vptr_hittable[1])(SUB84(time0_local,0),time1_local,peVar2,&box_right);
    if ((char)iVar12 != '\0') goto LAB_00105f3b;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"No bounding box in bvh_node constructor.\n",0x29);
LAB_00105f3b:
  uVar15 = (ulong)box_left._min.e[1] & -(ulong)(box_left._min.e[1] <= box_right._min.e[1]);
  auVar18._0_8_ = ~-(ulong)(box_left._min.e[0] <= box_right._min.e[0]) & (ulong)box_right._min.e[0];
  auVar18._8_8_ = ~-(ulong)(box_left._min.e[1] <= box_right._min.e[1]) & (ulong)box_right._min.e[1];
  auVar4._8_4_ = (int)uVar15;
  auVar4._0_8_ = (ulong)box_left._min.e[0] & -(ulong)(box_left._min.e[0] <= box_right._min.e[0]);
  auVar4._12_4_ = (int)(uVar15 >> 0x20);
  *(undefined1 (*) [16])(this->box)._min.e = auVar18 | auVar4;
  uVar15 = (ulong)box_left._max.e[0] & -(ulong)(box_right._max.e[0] <= box_left._max.e[0]);
  auVar19._0_8_ = ~-(ulong)(box_left._min.e[2] <= box_right._min.e[2]) & (ulong)box_right._min.e[2];
  auVar19._8_8_ = ~-(ulong)(box_right._max.e[0] <= box_left._max.e[0]) & (ulong)box_right._max.e[0];
  auVar5._8_4_ = (int)uVar15;
  auVar5._0_8_ = (ulong)box_left._min.e[2] & -(ulong)(box_left._min.e[2] <= box_right._min.e[2]);
  auVar5._12_4_ = (int)(uVar15 >> 0x20);
  *(undefined1 (*) [16])((this->box)._min.e + 2) = auVar19 | auVar5;
  uVar15 = (ulong)box_left._max.e[2] & -(ulong)(box_right._max.e[2] <= box_left._max.e[2]);
  auVar20._0_8_ = ~-(ulong)(box_right._max.e[1] <= box_left._max.e[1]) & (ulong)box_right._max.e[1];
  auVar20._8_8_ = ~-(ulong)(box_right._max.e[2] <= box_left._max.e[2]) & (ulong)box_right._max.e[2];
  auVar6._8_4_ = (int)uVar15;
  auVar6._0_8_ = (ulong)box_left._max.e[1] & -(ulong)(box_right._max.e[1] <= box_left._max.e[1]);
  auVar6._12_4_ = (int)(uVar15 >> 0x20);
  *(undefined1 (*) [16])((this->box)._max.e + 1) = auVar20 | auVar6;
  return;
}

Assistant:

bvh_node::bvh_node(
        std::vector<shared_ptr<hittable>>& objects,
        size_t start, size_t end, double time0, double time1
) {
    int axis = random_int(0,2);
    auto comparator = (axis == 0) ? box_x_compare
                    : (axis == 1) ? box_y_compare
                                  : box_z_compare;

    size_t object_span = end - start;

    if (object_span == 1) {
        left = right = objects[start];
    } else if (object_span == 2) {
        if (comparator(objects[start], objects[start+1])) {
            left = objects[start];
            right = objects[start+1];
        } else {
            left = objects[start+1];
            right = objects[start];
        }
    } else {
        std::sort(objects.begin() + start, objects.begin() + end, comparator);

        auto mid = start + object_span/2;
        left = make_shared<bvh_node>(objects, start, mid, time0, time1);
        right = make_shared<bvh_node>(objects, mid, end, time0, time1);
    }

    aabb box_left, box_right;

    if (  !left->bounding_box (time0, time1, box_left)
          || !right->bounding_box(time0, time1, box_right)
            )
        std::cerr << "No bounding box in bvh_node constructor.\n";

    box = surrounding_box(box_left, box_right);
}